

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>
::ConstraintKeeper(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>
                   *this,FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *cvt,char *nm,char *optnm)

{
  char *__s;
  allocator<char> *__a;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RSI;
  ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>
  *in_RDI;
  string *in_stack_fffffffffffffe78;
  ValueNode *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  allocator<char> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  BasicConstraintKeeper *in_stack_fffffffffffffee8;
  BasicConstraintKeeper *in_stack_fffffffffffffef0;
  allocator<char> local_f1;
  string local_f0 [32];
  BasicConstraintKeeper *in_stack_ffffffffffffff30;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [64];
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *local_10;
  
  local_10 = in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::GetValuePresolver(in_RSI);
  BasicConstraintKeeper::BasicConstraintKeeper
            (in_stack_fffffffffffffef0,(BasicValuePresolver *)in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  (in_RDI->super_BasicConstraintKeeper)._vptr_BasicConstraintKeeper =
       (_func_int **)&PTR__ConstraintKeeper_0096d940;
  in_RDI->cvt_ = (FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)local_10;
  std::
  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container>_>
  ::deque((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container>_>
           *)0x157d3d);
  in_RDI->i_cvt_last_ = -1;
  in_RDI->n_bridged_or_unused_ = 0;
  in_RDI->i_2add_next_ = 0;
  this_00 = &in_RDI->desc_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::GetTypeName();
  std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>
  ::GetTypeName();
  std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  __s = CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::ImplicationId>::
        GetTypeName();
  std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  BasicConstraintKeeper::GetValueNode(&in_RDI->super_BasicConstraintKeeper);
  __a = (allocator<char> *)BasicConstraintKeeper::GetShortTypeName(in_stack_ffffffffffffff30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  pre::ValueNode::SetName(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
  GetConverter(in_RDI);
  ConversionPriority((ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>
                      *)0x157f48);
  ConstraintManager::AddConstraintKeeper
            ((ConstraintManager *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (double)in_stack_fffffffffffffee0);
  return;
}

Assistant:

ConstraintKeeper(Converter& cvt, const char* nm, const char* optnm) :
      BasicConstraintKeeper(cvt.GetValuePresolver(), nm, optnm), cvt_(cvt)
  {
    GetValueNode().SetName(GetShortTypeName());  // change value node name
    GetConverter().AddConstraintKeeper(*this, ConversionPriority());
  }